

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

target_ulong_conflict
helper_lscbx_ppc(CPUPPCState_conflict *env,target_ulong_conflict addr,uint32_t reg,uint32_t ra,
                uint32_t rb)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  bool local_2e;
  int local_2c;
  int d;
  int c;
  int i;
  uint32_t rb_local;
  uint32_t ra_local;
  uint32_t reg_local;
  target_ulong_conflict addr_local;
  CPUPPCState_conflict *env_local;
  
  local_2c = 0x18;
  d = 0;
  rb_local = reg;
  ra_local = addr;
  while( true ) {
    if ((env->xer & 0x7f) <= (uint)d) {
      return d;
    }
    uVar1 = cpu_ldub_data_ra_ppc(env,ra_local,unaff_retaddr);
    ra_local = addr_add(env,ra_local,1);
    local_2e = false;
    if (rb_local != rb) {
      local_2e = ra == 0 || rb_local != ra;
    }
    if (local_2e) {
      env->gpr[rb_local] =
           env->gpr[rb_local] & (0xff << ((byte)local_2c & 0x1f) ^ 0xffffffffU) |
           uVar1 << ((byte)local_2c & 0x1f);
    }
    if (uVar1 == (env->xer >> 8 & 0xff)) break;
    if (local_2c == 0) {
      local_2c = 0x18;
      rb_local = rb_local + 1 & 0x1f;
    }
    else {
      local_2c = local_2c + -8;
    }
    d = d + 1;
  }
  return d;
}

Assistant:

target_ulong helper_lscbx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                          uint32_t ra, uint32_t rb)
{
    int i, c, d;

    d = 24;
    for (i = 0; i < xer_bc; i++) {
        c = cpu_ldub_data_ra(env, addr, GETPC());
        addr = addr_add(env, addr, 1);
        /* ra (if not 0) and rb are never modified */
        if (likely(reg != rb && (ra == 0 || reg != ra))) {
            env->gpr[reg] = (env->gpr[reg] & ~(0xFF << d)) | (c << d);
        }
        if (unlikely(c == xer_cmp)) {
            break;
        }
        if (likely(d != 0)) {
            d -= 8;
        } else {
            d = 24;
            reg++;
            reg = reg & 0x1F;
        }
    }
    return i;
}